

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O2

bool tinyusdz::BuildSkelTopology
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<int,_std::allocator<int>_> *dst,string *err)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  mapped_type_conflict2 *pmVar4;
  size_type sVar5;
  mapped_type_conflict2 mVar6;
  size_t i;
  ulong uVar7;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string *psVar8;
  long lVar9;
  int iVar10;
  Path *this;
  undefined1 uVar11;
  allocator local_251;
  string *local_250;
  undefined1 local_248 [16];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  pathMap;
  string local_1f0 [32];
  Path p;
  string _err;
  
  pTVar1 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    uVar11 = 1;
  }
  else {
    local_250 = err;
    local_248._8_8_ = dst;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              (&paths,(long)pTVar2 - (long)pTVar1 >> 5,(allocator_type *)&p);
    local_248._0_8_ = (pointer)0x0;
    while( true ) {
      pTVar1 = (joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar11 = (pointer)((long)(joints->
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <=
               (ulong)local_248._0_8_;
      if ((bool)uVar11) break;
      psVar8 = &pTVar1[local_248._0_8_].str_;
      ::std::__cxx11::string::string((string *)&_err,"",(allocator *)&pathMap);
      Path::Path(&p,psVar8,&_err);
      ::std::__cxx11::string::_M_dispose();
      psVar8 = local_250;
      if (p._valid == false) {
        if (local_250 != (string *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&pathMap,"joints[{}] is invalid Prim path: `{}`",
                     (allocator *)local_1f0);
          fmt::format<unsigned_long,std::__cxx11::string>
                    (&_err,(fmt *)&pathMap,(string *)local_248,
                     (unsigned_long *)
                     ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                      )._M_impl.super__Vector_impl_data._M_start + local_248._0_8_),in_R8);
LAB_00468fee:
          ::std::__cxx11::string::append((string *)psVar8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
LAB_00469009:
        Path::~Path(&p);
        goto LAB_00469016;
      }
      if ((p._prim_part._M_string_length == 1) && (*p._prim_part._M_dataplus._M_p == '/')) {
        if (local_250 != (string *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&pathMap,
                     "joints[{}] Root Prim path \'/\' cannot be used for joint Prim path.",
                     (allocator *)local_1f0);
          fmt::format<unsigned_long>(&_err,(string *)&pathMap,(unsigned_long *)local_248);
          goto LAB_00468fee;
        }
        goto LAB_00469009;
      }
      _err._M_dataplus._M_p = (pointer)&_err.field_2;
      _err._M_string_length = 0;
      _err.field_2._M_local_buf[0] = '\0';
      bVar3 = pathutil::ValidatePrimPath(&p,&_err);
      if (bVar3) {
        Path::operator=(paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                        _M_impl.super__Vector_impl_data._M_start + local_248._0_8_,&p);
      }
      else if (local_250 != (string *)0x0) {
        ::std::__cxx11::string::string
                  (local_1f0,"joints[{}] is not a valid Prim path: `{}`, reason = {}",&local_251);
        in_R8 = &_err;
        fmt::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                  ((string *)&pathMap,(fmt *)local_1f0,(string *)local_248,
                   (unsigned_long *)
                   ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                    _M_impl.super__Vector_impl_data._M_start + local_248._0_8_),&_err,in_R9);
        ::std::__cxx11::string::append((string *)local_250);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
      Path::~Path(&p);
      if (!bVar3) goto LAB_00469016;
      local_248._0_8_ = local_248._0_8_ + 1;
    }
    pathMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &pathMap._M_t._M_impl.super__Rb_tree_header._M_header;
    pathMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pathMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    pathMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar9 = 0;
    pathMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         pathMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)paths.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)paths.
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0xd0); uVar7 = uVar7 + 1)
    {
      pmVar4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&pathMap,(key_type *)
                                     ((long)&((paths.
                                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _prim_part)._M_dataplus._M_p + lVar9));
      *pmVar4 = (mapped_type_conflict2)uVar7;
      lVar9 = lVar9 + 0xd0;
    }
    local_250 = (string *)CONCAT71(local_250._1_7_,uVar11);
    ::std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_248._8_8_,
               (long)(joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)paths.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)paths.
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0xd0); uVar7 = uVar7 + 1)
    {
      this = paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start + uVar7;
      bVar3 = Path::is_root_path(this);
      mVar6 = -1;
      if (!bVar3) {
        Path::get_parent_prim_path(&p,this);
        iVar10 = 0x20000;
        do {
          if ((p._valid != true) ||
             ((p._prim_part._M_string_length == 1 && (*p._prim_part._M_dataplus._M_p == '/'))))
          break;
          sVar5 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::count(&pathMap,(key_type *)&p);
          if (sVar5 != 0) {
            pmVar4 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(&pathMap,(key_type *)&p);
            mVar6 = *pmVar4;
            goto LAB_00468f3a;
          }
          Path::get_parent_prim_path((Path *)&_err,&p);
          Path::operator=(&p,(Path *)&_err);
          Path::~Path((Path *)&_err);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        mVar6 = -1;
LAB_00468f3a:
        Path::~Path(&p);
      }
      (((_Vector_base<int,_std::allocator<int>_> *)local_248._8_8_)->_M_impl).
      super__Vector_impl_data._M_start[uVar7] = mVar6;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&pathMap._M_t);
    uVar11 = local_250._0_1_;
LAB_00469016:
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&paths);
  }
  return (bool)uVar11;
}

Assistant:

bool BuildSkelTopology(
  const std::vector<value::token> &joints,
  std::vector<int> &dst,
  std::string *err) {

  if (joints.empty()) {
    return true;
  }

  std::vector<Path> paths(joints.size());
  for (size_t i = 0; i < joints.size(); i++) {
    Path p = Path(joints[i].str(), "");

    if (!p.is_valid()) {
      if (err) {
        (*err) += fmt::format("joints[{}] is invalid Prim path: `{}`", i, joints[i].str());
      }
      return false;
    }

    if (p.is_root_path()) {
      if (err) {
        (*err) += fmt::format("joints[{}] Root Prim path '/' cannot be used for joint Prim path.", i);
      }
      return false;
    }

    std::string _err;

    if (!pathutil::ValidatePrimPath(p, &_err)) {
      if (err) {
        (*err) += fmt::format("joints[{}] is not a valid Prim path: `{}`, reason = {}", i, joints[i].str(), _err);
      }
      return false;
    }
    
    paths[i] = p;
  }

  // path name <-> index map
  std::map<std::string, int> pathMap;
  for (size_t i = 0; i < paths.size(); i++) {
    pathMap[paths[i].prim_part()] = int(i); 
  }

  auto GetParentIndex = [](const std::map<std::string, int> &_pathMap, const Path &path) -> int {
    if (path.is_root_path()) {
      return -1;
    }
  
    // from pxrUSD's comment...
    //
    // Recurse over all ancestor paths, not just the direct parent.
    // For instance, if the map includes only paths 'a' and 'a/b/c',
    // 'a' will be treated as the parent of 'a/b/c'.
    //
    Path parentPath = path.get_parent_prim_path();
     
    uint32_t kMaxRec = 1024 * 128; // to avoid infinite loop.

    uint32_t depth = 0;
    while (parentPath.is_valid() && !parentPath.is_root_path()) {

      if (_pathMap.count(parentPath.prim_part())) {
        return _pathMap.at(parentPath.prim_part());
      } else {
      }

      parentPath = parentPath.get_parent_prim_path();
      depth++;

      if (depth >= kMaxRec) {
        // TODO: Report error
        return -1;
      } 
    }

    return -1;
  };

  dst.resize(joints.size());
  for (size_t i = 0; i < paths.size(); i++) {
    dst[i] = GetParentIndex(pathMap, paths[i]);
  }

  return true;
}